

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SequenceRepetitionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SequenceRepetitionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SelectorSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,SelectorSyntax **args_2,Token *args_3)

{
  Token closeBracket;
  SequenceRepetitionSyntax *this_00;
  Token *in_RDX;
  long in_RSI;
  Token *in_R8;
  SelectorSyntax *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  this_00 = (SequenceRepetitionSyntax *)
            allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     (size_t)in_stack_ffffffffffffff98);
  closeBracket.info = (Info *)in_R8;
  closeBracket._0_8_ = *(undefined8 *)(in_RSI + 8);
  slang::syntax::SequenceRepetitionSyntax::SequenceRepetitionSyntax
            (this_00,*in_RDX,*in_R8,in_stack_ffffffffffffff98,closeBracket);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }